

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_list_sync_read(t_rs_generator *this,t_list *tlist,string *list_var)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  t_type *ttype;
  ostream *poVar3;
  string list_elem_var;
  string local_90;
  string local_70;
  string local_50;
  
  ttype = tlist->elem_type_;
  poVar1 = &this->f_gen_;
  t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"let list_ident = i_prot.read_list_begin()?;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"let mut ");
  poVar3 = std::operator<<(poVar3,(string *)list_var);
  poVar3 = std::operator<<(poVar3,": ");
  to_rust_type_abi_cxx11_(&local_90,this,(t_type *)tlist);
  poVar3 = std::operator<<(poVar3,(string *)&local_90);
  poVar3 = std::operator<<(poVar3," = Vec::with_capacity(list_ident.size as usize);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"for _ in 0..list_ident.size {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  std::__cxx11::string::string((string *)&local_50,"list_elem_",(allocator *)&local_90);
  t_generator::tmp(&local_70,&this->super_t_generator,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  render_type_sync_read(this,&local_70,ttype,false);
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,(string *)list_var);
  poVar3 = std::operator<<(poVar3,".push(");
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,");");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"i_prot.read_list_end()?;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void t_rs_generator::render_list_sync_read(t_list *tlist, const string &list_var) {
  t_type* elem_type = tlist->get_elem_type();

  f_gen_ << indent() << "let list_ident = i_prot.read_list_begin()?;" << endl;
  f_gen_
    << indent()
    << "let mut " << list_var << ": " << to_rust_type((t_type*) tlist)
    << " = Vec::with_capacity(list_ident.size as usize);"
    << endl;
  f_gen_ << indent() << "for _ in 0..list_ident.size {" << endl;

  indent_up();

  string list_elem_var = tmp("list_elem_");
  render_type_sync_read(list_elem_var, elem_type);
  f_gen_ << indent() << list_var << ".push(" << list_elem_var << ");" << endl;

  indent_down();

  f_gen_ << indent() << "}" << endl;
  f_gen_ << indent() << "i_prot.read_list_end()?;" << endl;
}